

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

void quaternion_get_axis_anglev3(quaternion *self,vector3 *vR,double *angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 1.0 - (self->field_0).q[3] * (self->field_0).q[3];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = -dVar1;
  if (-dVar1 <= dVar1) {
    dVar2 = dVar1;
  }
  if (dVar2 < 1e-05) {
    (vR->field_0).v[0] = (self->field_0).q[0];
    (vR->field_0).v[1] = (self->field_0).q[1];
    dVar1 = (self->field_0).q[2];
  }
  else {
    (vR->field_0).v[0] = (self->field_0).q[0] / dVar1;
    (vR->field_0).v[1] = (self->field_0).q[1] / dVar1;
    dVar1 = (self->field_0).q[2] / dVar1;
  }
  (vR->field_0).v[2] = dVar1;
  dVar1 = acos((self->field_0).q[3]);
  *angle = dVar1 + dVar1;
  return;
}

Assistant:

HYPAPI void quaternion_get_axis_anglev3(const struct quaternion *self, struct vector3 *vR, HYP_FLOAT *angle)
{
	/* scale is not same as magnitude */
	HYP_FLOAT scale = HYP_SQRT(1.0f - self->w * self->w);

	/* avoid divide by zero */
	if (scalar_equalsf(scale, 0.0f)) {
		vR->x = self->x;
		vR->y = self->y;
		vR->z = self->z;
	} else {
		vR->x = self->x / scale;
		vR->y = self->y / scale;
		vR->z = self->z / scale;
	}

	*angle = 2.0f * HYP_ACOS(self->w);
}